

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::DescriptorProto::_InternalParse(DescriptorProto *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  byte bVar1;
  int iVar2;
  Rep *pRVar3;
  internal *piVar4;
  char *pcVar5;
  bool bVar6;
  DescriptorProto_ExtensionRange *msg;
  string *psVar7;
  DescriptorProto *msg_00;
  EnumDescriptorProto *msg_01;
  OneofDescriptorProto *msg_02;
  FieldDescriptorProto *pFVar8;
  MessageOptions *msg_03;
  DescriptorProto_ReservedRange *msg_04;
  ArenaStringPtr *field_name;
  Rep *pRVar9;
  int iVar10;
  Arena *pAVar11;
  UnknownFieldSet *unknown;
  byte *pbVar12;
  char cVar13;
  uint res;
  pair<const_char_*,_unsigned_int> pVar14;
  StringPiece str;
  StringPiece str_00;
  byte *local_38;
  
  local_38 = (byte *)ptr;
  bVar6 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar6) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    this_01 = &this->name_;
    do {
      bVar1 = *local_38;
      res = (uint)bVar1;
      pbVar12 = local_38 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar12 * 0x80) - 0x80;
        if ((char)*pbVar12 < '\0') {
          pVar14 = internal::ReadTagFallback((char *)local_38,res);
          pbVar12 = (byte *)pVar14.first;
          if (pbVar12 == (byte *)0x0) {
            return (char *)0x0;
          }
          res = pVar14.second;
        }
        else {
          pbVar12 = local_38 + 2;
        }
      }
      cVar13 = (char)res;
      local_38 = pbVar12;
      switch(res >> 3) {
      case 1:
        if (cVar13 != '\n') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pAVar11 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar11 & 1) != 0) {
          pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
        }
        psVar7 = this_01->ptr_;
        field_name = this_01;
        if (psVar7 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_01,pAVar11,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar7 = this_01->ptr_;
        }
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar7,(char *)local_38,ctx);
        piVar4 = (internal *)(psVar7->_M_dataplus)._M_p;
        pcVar5 = (char *)psVar7->_M_string_length;
        if ((long)pcVar5 < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)pcVar5,"size_t to int conversion");
        }
        str.length_ = (stringpiece_ssize_type)"google.protobuf.DescriptorProto.name";
        str.ptr_ = pcVar5;
        internal::VerifyUTF8(piVar4,str,(char *)field_name);
        goto joined_r0x00296018;
      case 2:
        if (cVar13 != '\x12') break;
        local_38 = pbVar12 + -1;
        do {
          local_38 = local_38 + 1;
          pRVar9 = (this->field_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar9 == (Rep *)0x0) {
            iVar10 = (this->field_).super_RepeatedPtrFieldBase.total_size_;
LAB_00295d71:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->field_).super_RepeatedPtrFieldBase,iVar10 + 1);
            pRVar9 = (this->field_).super_RepeatedPtrFieldBase.rep_;
            iVar10 = pRVar9->allocated_size;
LAB_00295d82:
            pRVar9->allocated_size = iVar10 + 1;
            pFVar8 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                               ((this->field_).super_RepeatedPtrFieldBase.arena_);
            pRVar9 = (this->field_).super_RepeatedPtrFieldBase.rep_;
            iVar10 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
            (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1;
            pRVar9->elements[iVar10] = pFVar8;
          }
          else {
            iVar2 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
            iVar10 = pRVar9->allocated_size;
            if (iVar10 <= iVar2) {
              if (iVar10 == (this->field_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00295d71;
              goto LAB_00295d82;
            }
            (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            pFVar8 = (FieldDescriptorProto *)pRVar9->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::
                             ParseMessage<google::protobuf::FieldDescriptorProto>
                                       (ctx,pFVar8,(char *)local_38);
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x12));
        goto LAB_0029601a;
      case 3:
        if (cVar13 == '\x1a') {
          local_38 = pbVar12 + -1;
          do {
            local_38 = local_38 + 1;
            pRVar9 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar9 == (Rep *)0x0) {
              iVar10 = (this->nested_type_).super_RepeatedPtrFieldBase.total_size_;
LAB_00295b49:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->nested_type_).super_RepeatedPtrFieldBase,iVar10 + 1);
              pRVar9 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
              iVar10 = pRVar9->allocated_size;
LAB_00295b5a:
              pRVar9->allocated_size = iVar10 + 1;
              msg_00 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto>
                                 ((this->nested_type_).super_RepeatedPtrFieldBase.arena_);
              pRVar9 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
              iVar10 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
              (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1;
              pRVar9->elements[iVar10] = msg_00;
            }
            else {
              iVar2 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
              iVar10 = pRVar9->allocated_size;
              if (iVar10 <= iVar2) {
                if (iVar10 == (this->nested_type_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_00295b49;
                goto LAB_00295b5a;
              }
              (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              msg_00 = (DescriptorProto *)pRVar9->elements[iVar2];
            }
            local_38 = (byte *)internal::ParseContext::
                               ParseMessage<google::protobuf::DescriptorProto>
                                         (ctx,msg_00,(char *)local_38);
            if (local_38 == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x1a));
          goto LAB_0029601a;
        }
        break;
      case 4:
        if (cVar13 == '\"') {
          local_38 = pbVar12 + -1;
          do {
            local_38 = local_38 + 1;
            pRVar9 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar9 == (Rep *)0x0) {
              iVar10 = (this->enum_type_).super_RepeatedPtrFieldBase.total_size_;
LAB_00295bf6:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar10 + 1);
              pRVar9 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
              iVar10 = pRVar9->allocated_size;
LAB_00295c07:
              pRVar9->allocated_size = iVar10 + 1;
              msg_01 = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto>
                                 ((this->enum_type_).super_RepeatedPtrFieldBase.arena_);
              pRVar9 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
              iVar10 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
              (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1;
              pRVar9->elements[iVar10] = msg_01;
            }
            else {
              iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
              iVar10 = pRVar9->allocated_size;
              if (iVar10 <= iVar2) {
                if (iVar10 == (this->enum_type_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_00295bf6;
                goto LAB_00295c07;
              }
              (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              msg_01 = (EnumDescriptorProto *)pRVar9->elements[iVar2];
            }
            local_38 = (byte *)internal::ParseContext::
                               ParseMessage<google::protobuf::EnumDescriptorProto>
                                         (ctx,msg_01,(char *)local_38);
            if (local_38 == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x22));
          goto LAB_0029601a;
        }
        break;
      case 5:
        if (cVar13 == '*') {
          local_38 = pbVar12 + -1;
          do {
            local_38 = local_38 + 1;
            pRVar9 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar9 == (Rep *)0x0) {
              iVar10 = (this->extension_range_).super_RepeatedPtrFieldBase.total_size_;
LAB_00295948:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->extension_range_).super_RepeatedPtrFieldBase,iVar10 + 1);
              pRVar9 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
              iVar10 = pRVar9->allocated_size;
LAB_00295959:
              pRVar9->allocated_size = iVar10 + 1;
              msg = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ExtensionRange>
                              ((this->extension_range_).super_RepeatedPtrFieldBase.arena_);
              pRVar9 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
              iVar10 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
              (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1;
              pRVar9->elements[iVar10] = msg;
            }
            else {
              iVar2 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
              iVar10 = pRVar9->allocated_size;
              if (iVar10 <= iVar2) {
                if (iVar10 == (this->extension_range_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_00295948;
                goto LAB_00295959;
              }
              (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              msg = (DescriptorProto_ExtensionRange *)pRVar9->elements[iVar2];
            }
            local_38 = (byte *)internal::ParseContext::
                               ParseMessage<google::protobuf::DescriptorProto_ExtensionRange>
                                         (ctx,msg,(char *)local_38);
            if (local_38 == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x2a));
          goto LAB_0029601a;
        }
        break;
      case 6:
        if (cVar13 == '2') {
          local_38 = pbVar12 + -1;
          do {
            local_38 = local_38 + 1;
            pRVar9 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar9 == (Rep *)0x0) {
              iVar10 = (this->extension_).super_RepeatedPtrFieldBase.total_size_;
LAB_00295e24:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->extension_).super_RepeatedPtrFieldBase,iVar10 + 1);
              pRVar9 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
              iVar10 = pRVar9->allocated_size;
LAB_00295e38:
              pRVar9->allocated_size = iVar10 + 1;
              pFVar8 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                                 ((this->extension_).super_RepeatedPtrFieldBase.arena_);
              pRVar9 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
              iVar10 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
              (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1;
              pRVar9->elements[iVar10] = pFVar8;
            }
            else {
              iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
              iVar10 = pRVar9->allocated_size;
              if (iVar10 <= iVar2) {
                if (iVar10 == (this->extension_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_00295e24;
                goto LAB_00295e38;
              }
              (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              pFVar8 = (FieldDescriptorProto *)pRVar9->elements[iVar2];
            }
            local_38 = (byte *)internal::ParseContext::
                               ParseMessage<google::protobuf::FieldDescriptorProto>
                                         (ctx,pFVar8,(char *)local_38);
            if (local_38 == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x32));
          goto LAB_0029601a;
        }
        break;
      case 7:
        if (cVar13 == ':') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          msg_03 = this->options_;
          if (msg_03 == (MessageOptions *)0x0) {
            pAVar11 = (Arena *)this_00->ptr_;
            if (((ulong)pAVar11 & 1) != 0) {
              pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
            }
            msg_03 = Arena::CreateMaybeMessage<google::protobuf::MessageOptions>(pAVar11);
            this->options_ = msg_03;
          }
          local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::MessageOptions>
                                       (ctx,msg_03,(char *)local_38);
          goto joined_r0x00296018;
        }
        break;
      case 8:
        if (cVar13 == 'B') {
          local_38 = pbVar12 + -1;
          do {
            local_38 = local_38 + 1;
            pRVar9 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar9 == (Rep *)0x0) {
              iVar10 = (this->oneof_decl_).super_RepeatedPtrFieldBase.total_size_;
LAB_00295ca9:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->oneof_decl_).super_RepeatedPtrFieldBase,iVar10 + 1);
              pRVar9 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
              iVar10 = pRVar9->allocated_size;
LAB_00295cbd:
              pRVar9->allocated_size = iVar10 + 1;
              msg_02 = Arena::CreateMaybeMessage<google::protobuf::OneofDescriptorProto>
                                 ((this->oneof_decl_).super_RepeatedPtrFieldBase.arena_);
              pRVar9 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
              iVar10 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
              (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1;
              pRVar9->elements[iVar10] = msg_02;
            }
            else {
              iVar2 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
              iVar10 = pRVar9->allocated_size;
              if (iVar10 <= iVar2) {
                if (iVar10 == (this->oneof_decl_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_00295ca9;
                goto LAB_00295cbd;
              }
              (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              msg_02 = (OneofDescriptorProto *)pRVar9->elements[iVar2];
            }
            local_38 = (byte *)internal::ParseContext::
                               ParseMessage<google::protobuf::OneofDescriptorProto>
                                         (ctx,msg_02,(char *)local_38);
            if (local_38 == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x42));
          goto LAB_0029601a;
        }
        break;
      case 9:
        if (cVar13 == 'J') {
          local_38 = pbVar12 + -1;
          do {
            local_38 = local_38 + 1;
            pRVar9 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar9 == (Rep *)0x0) {
              iVar10 = (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_;
LAB_00295f3e:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->reserved_range_).super_RepeatedPtrFieldBase,iVar10 + 1);
              pRVar9 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
              iVar10 = pRVar9->allocated_size;
LAB_00295f52:
              pRVar9->allocated_size = iVar10 + 1;
              msg_04 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ReservedRange>
                                 ((this->reserved_range_).super_RepeatedPtrFieldBase.arena_);
              pRVar9 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
              iVar10 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
              (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1;
              pRVar9->elements[iVar10] = msg_04;
            }
            else {
              iVar2 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
              iVar10 = pRVar9->allocated_size;
              if (iVar10 <= iVar2) {
                if (iVar10 == (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_00295f3e;
                goto LAB_00295f52;
              }
              (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              msg_04 = (DescriptorProto_ReservedRange *)pRVar9->elements[iVar2];
            }
            local_38 = (byte *)internal::ParseContext::
                               ParseMessage<google::protobuf::DescriptorProto_ReservedRange>
                                         (ctx,msg_04,(char *)local_38);
            if (local_38 == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x4a));
          goto LAB_0029601a;
        }
        break;
      case 10:
        if (cVar13 == 'R') {
          local_38 = pbVar12 + -1;
          do {
            local_38 = local_38 + 1;
            pRVar9 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar9 == (Rep *)0x0) {
              iVar10 = (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_;
LAB_00295a27:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->reserved_name_).super_RepeatedPtrFieldBase,iVar10 + 1);
              pRVar9 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
              iVar10 = pRVar9->allocated_size;
LAB_00295a3a:
              pRVar9->allocated_size = iVar10 + 1;
              pAVar11 = (this->reserved_name_).super_RepeatedPtrFieldBase.arena_;
              if (pAVar11 == (Arena *)0x0) {
                psVar7 = (string *)operator_new(0x20);
              }
              else {
                if (pAVar11->hooks_cookie_ != (void *)0x0) {
                  Arena::OnArenaAllocation
                            (pAVar11,(type_info *)&std::__cxx11::string::typeinfo,0x20);
                }
                psVar7 = (string *)
                         internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                   (&pAVar11->impl_,0x20,
                                    internal::arena_destruct_object<std::__cxx11::string>);
              }
              (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
              psVar7->_M_string_length = 0;
              (psVar7->field_2)._M_local_buf[0] = '\0';
              pRVar3 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
              iVar10 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
              pRVar9 = (Rep *)(long)iVar10;
              (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1;
              pRVar3->elements[(long)pRVar9] = psVar7;
            }
            else {
              iVar2 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
              iVar10 = pRVar9->allocated_size;
              if (iVar10 <= iVar2) {
                if (iVar10 == (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_00295a27;
                goto LAB_00295a3a;
              }
              (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              psVar7 = (string *)pRVar9->elements[iVar2];
            }
            local_38 = (byte *)internal::InlineGreedyStringParser(psVar7,(char *)local_38,ctx);
            piVar4 = (internal *)(psVar7->_M_dataplus)._M_p;
            pcVar5 = (char *)psVar7->_M_string_length;
            if ((long)pcVar5 < 0) {
              StringPiece::LogFatalSizeTooBig((size_t)pcVar5,"size_t to int conversion");
            }
            str_00.length_ = (stringpiece_ssize_type)"google.protobuf.DescriptorProto.reserved_name"
            ;
            str_00.ptr_ = pcVar5;
            internal::VerifyUTF8(piVar4,str_00,(char *)pRVar9);
            if (local_38 == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x52));
          goto LAB_0029601a;
        }
      }
      if ((res == 0) || ((res & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        return (char *)pbVar12;
      }
      if (((ulong)this_00->ptr_ & 1) == 0) {
        unknown = internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
      }
      else {
        unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
      }
      local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
joined_r0x00296018:
      if (local_38 == (byte *)0x0) {
        return (char *)0x0;
      }
LAB_0029601a:
      bVar6 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar6);
  }
  return (char *)local_38;
}

Assistant:

const char* DescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.DescriptorProto.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_field(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_nested_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_enum_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MessageOptions options = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_oneof_decl(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<66>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_reserved_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<74>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string reserved_name = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr -= 1;
          do {
            ptr += 1;
            auto str = _internal_add_reserved_name();
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
            #ifndef NDEBUG
            ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.DescriptorProto.reserved_name");
            #endif  // !NDEBUG
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<82>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}